

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O2

void __thiscall EDColor::validateEdgeSegments(EDColor *this)

{
  int *piVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ushort uVar9;
  double *pdVar10;
  int i;
  long lVar11;
  pointer pvVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  pointer pvVar18;
  long lVar19;
  pointer *ppPVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int i_1;
  ulong uVar27;
  bool bVar28;
  allocator local_171;
  void *local_170;
  long local_168;
  long local_160;
  long local_158;
  EDColor *local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  uchar *local_110;
  uchar *local_108;
  uchar *local_100;
  uchar *local_f8;
  long local_f0;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  string local_c8 [32];
  _InputArray local_a8;
  Mat gradImage;
  
  pdVar10 = (double *)operator_new__(0x40000);
  this->H = pdVar10;
  memset(pdVar10,0,0x40000);
  memset(this->edgeImg,0,(long)this->height * (long)this->width);
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  local_170 = operator_new__(0x20000);
  memset(local_170,0,0x20000);
  iVar22 = this->height;
  local_168 = (long)iVar22;
  local_148 = local_168 + -1;
  local_158 = (long)this->width;
  local_f0 = local_158 + -1;
  local_160 = local_158 * 2;
  lVar13 = 1;
  lVar24 = local_160;
  lVar6 = local_160;
  lVar7 = local_158;
  lVar8 = 0;
  while (lVar23 = lVar8, lVar19 = lVar7, lVar17 = lVar6, lVar11 = lVar24, lVar13 < local_148) {
    lVar13 = lVar13 + 1;
    puVar3 = this->smooth_L;
    puVar4 = this->smooth_a;
    puVar5 = this->smooth_b;
    local_110 = puVar3 + lVar11;
    local_f8 = puVar3 + lVar19;
    local_100 = puVar4 + lVar19;
    local_108 = puVar5 + lVar19;
    local_118 = (long)this->gradImg + lVar17;
    for (lVar24 = 1; lVar24 < local_f0; lVar24 = lVar24 + 1) {
      iVar25 = ((uint)local_f8[lVar24 + 1] +
                ((uint)puVar3[lVar24 + lVar23 + 1] - (uint)local_110[lVar24 + -1]) +
               ((uint)local_110[lVar24 + 1] - (uint)puVar3[lVar24 + lVar23 + -1])) -
               (uint)local_f8[lVar24 + -1];
      iVar2 = -iVar25;
      if (0 < iVar25) {
        iVar2 = iVar25;
      }
      iVar14 = ((uint)local_110[lVar24] +
               ((uint)local_110[lVar24 + 1] - (uint)puVar3[lVar24 + lVar23 + -1])) -
               ((uint)puVar3[lVar24 + lVar23] +
               ((uint)puVar3[lVar24 + lVar23 + 1] - (uint)local_110[lVar24 + -1]));
      iVar25 = -iVar14;
      if (0 < iVar14) {
        iVar25 = iVar14;
      }
      iVar26 = ((uint)local_100[lVar24 + 1] +
                ((uint)puVar4[lVar24 + lVar23 + 1] - (uint)puVar4[lVar24 + lVar11 + -1]) +
               ((uint)puVar4[lVar24 + lVar11 + 1] - (uint)puVar4[lVar24 + lVar23 + -1])) -
               (uint)local_100[lVar24 + -1];
      iVar14 = -iVar26;
      if (0 < iVar26) {
        iVar14 = iVar26;
      }
      iVar21 = ((uint)puVar4[lVar24 + lVar11] +
               ((uint)puVar4[lVar24 + lVar11 + 1] - (uint)puVar4[lVar24 + lVar23 + -1])) -
               ((uint)puVar4[lVar24 + lVar23] +
               ((uint)puVar4[lVar24 + lVar23 + 1] - (uint)puVar4[lVar24 + lVar11 + -1]));
      iVar26 = -iVar21;
      if (0 < iVar21) {
        iVar26 = iVar21;
      }
      iVar15 = ((uint)local_108[lVar24 + 1] +
                ((uint)puVar5[lVar24 + lVar23 + 1] - (uint)puVar5[lVar24 + lVar11 + -1]) +
               ((uint)puVar5[lVar24 + lVar11 + 1] - (uint)puVar5[lVar24 + lVar23 + -1])) -
               (uint)local_108[lVar24 + -1];
      iVar21 = -iVar15;
      if (0 < iVar15) {
        iVar21 = iVar15;
      }
      iVar16 = ((uint)puVar5[lVar24 + lVar11] +
               ((uint)puVar5[lVar24 + lVar11 + 1] - (uint)puVar5[lVar24 + lVar23 + -1])) -
               ((uint)puVar5[lVar24 + lVar23] +
               ((uint)puVar5[lVar24 + lVar23 + 1] - (uint)puVar5[lVar24 + lVar11 + -1]));
      iVar15 = -iVar16;
      if (0 < iVar16) {
        iVar15 = iVar16;
      }
      uVar9 = (ushort)((iVar15 + iVar26 + iVar14 + iVar25 + iVar2 + iVar21 + 2U & 0xffff) / 3);
      *(ushort *)(local_118 + lVar24 * 2) = uVar9;
      piVar1 = (int *)((long)local_170 + (ulong)uVar9 * 4);
      *piVar1 = *piVar1 + 1;
    }
    lVar24 = lVar11 + local_158;
    lVar6 = lVar17 + local_160;
    lVar7 = lVar19 + local_158;
    lVar8 = lVar23 + local_158;
    local_140 = lVar13;
    local_138 = lVar11;
    local_130 = lVar23;
    local_128 = lVar19;
    local_120 = lVar17;
  }
  local_150 = this;
  cv::Mat::Mat(&gradImage,iVar22,this->width,3,this->gradImg,0);
  std::__cxx11::string::string(local_c8,"newGrad.pgm",&local_171);
  local_a8.sz.width = 0;
  local_a8.sz.height = 0;
  local_a8.flags = 0x1010000;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.obj = &gradImage;
  cv::imwrite(local_c8,&local_a8,(vector *)&local_e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
  std::__cxx11::string::~string(local_c8);
  iVar22 = this->width;
  iVar2 = this->height;
  for (lVar13 = 0x7ffe; lVar13 != -1; lVar13 = lVar13 + -1) {
    piVar1 = (int *)((long)local_170 + lVar13 * 4);
    *piVar1 = *piVar1 + *(int *)((long)local_170 + lVar13 * 4 + 4);
  }
  pdVar10 = this->H;
  for (lVar13 = 0; lVar13 != 0x8000; lVar13 = lVar13 + 1) {
    pdVar10[lVar13] =
         (double)*(int *)((long)local_170 + lVar13 * 4) / (double)((iVar2 + -2) * (iVar22 + -2));
  }
  this->np = 0;
  pvVar18 = (this->segments).
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = (this->segments).
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = ((long)pvVar12 - (long)pvVar18) / 0x18;
  ppPVar20 = (pointer *)
             ((long)&(pvVar18->
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl
                     .super__Vector_impl_data + 8);
  iVar22 = 0;
  while (bVar28 = lVar13 != 0, lVar13 = lVar13 + -1, bVar28) {
    iVar2 = (int)((ulong)((long)*ppPVar20 - (long)((_Vector_impl_data *)(ppPVar20 + -1))->_M_start)
                 >> 3);
    iVar22 = iVar22 + ((iVar2 + -1) * iVar2) / 2;
    this->np = iVar22;
    ppPVar20 = ppPVar20 + 3;
  }
  lVar13 = 8;
  for (uVar27 = 0; uVar27 < (ulong)(((long)pvVar12 - (long)pvVar18) / 0x18); uVar27 = uVar27 + 1) {
    testSegment(this,(int)uVar27,0,
                (int)((ulong)(*(long *)((long)&(pvVar18->
                                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                               )._M_impl.super__Vector_impl_data + lVar13) -
                             *(long *)((long)pvVar18 + lVar13 + -8)) >> 3) + -1);
    pvVar18 = (this->segments).
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (this->segments).
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = lVar13 + 0x18;
  }
  if (this->H != (double *)0x0) {
    operator_delete__(this->H);
  }
  operator_delete__(local_170);
  cv::Mat::~Mat(&gradImage);
  return;
}

Assistant:

void EDColor::validateEdgeSegments()
{
	int maxGradValue = MAX_GRAD_VALUE;
	H = new double[maxGradValue];
	memset(H, 0, sizeof(double)*maxGradValue);

	memset(edgeImg, 0, width*height); // clear edge image
	
	// Compute the gradient
	memset(gradImg, 0, sizeof(short)*width*height); // reset gradient Image pixels to zero

	int *grads = new int[maxGradValue];
	memset(grads, 0, sizeof(int)*maxGradValue);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Gradient for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = abs(com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]));
			int gyCh1 = abs(com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]));
			int ch1Grad = gxCh1 + gyCh1;

			// Gradient for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = abs(com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]));
			int gyCh2 = abs(com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]));
			int ch2Grad = gxCh2 + gyCh2;

			// Gradient for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = abs(com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]));
			int gyCh3 = abs(com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]));
			int ch3Grad = gxCh3 + gyCh3;

			// Take average
			int grad = (ch1Grad + ch2Grad + ch3Grad + 2) / 3;

			gradImg[i*width + j] = grad;
			grads[grad]++;
		} //end-for
	} //end-for

	Mat gradImage = Mat(height, width, CV_16SC1, gradImg);
	imwrite("newGrad.pgm", gradImage);

	// Compute probability function H
	int size = (width - 2)*(height - 2);
	//  size -= grads[0];
	
	for (int i = maxGradValue - 1; i>0; i--) 
		grads[i - 1] += grads[i];
	
	for (int i = 0; i<maxGradValue; i++) 
		H[i] = (double)grads[i] / ((double)size);

	// Compute np: # of segment pieces
	np = 0;
	for (int i = 0; i<segments.size(); i++) {
		int len = (int)segments[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	// Validate segments
	for (int i = 0; i< segments.size(); i++) {
		testSegment(i, 0, (int)segments[i].size() - 1);
	} //end-for

	// clear space
	delete[] H;
	delete[] grads;
}